

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
recoverKey(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          string *password,vector<unsigned_char,_std::allocator<unsigned_char>_> *protectedKey)

{
  pointer *md;
  undefined4 uVar1;
  pointer puVar2;
  int iVar3;
  undefined8 uVar4;
  uint uVar5;
  undefined8 *puVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  value_type_conflict1 *__val;
  long lVar10;
  uint uVar11;
  size_type __n;
  long lVar12;
  int iVar13;
  undefined1 local_130 [8];
  SHA_CTX context;
  undefined1 local_b8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encrKey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> xorKey;
  uint8_t digest [20];
  undefined1 local_68 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> passwdBytes;
  allocator_type local_31;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
             password->_M_string_length * 2,(allocator_type *)local_130);
  if (password->_M_string_length != 0) {
    uVar9 = 0;
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar11 = uVar7 + 1;
      *(uchar *)((long)local_68 + (ulong)uVar7) = '\0';
      uVar7 = uVar7 + 2;
      *(char *)((long)local_68 + (ulong)uVar11) = (password->_M_dataplus)._M_p[uVar9];
      uVar9 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
    } while (uVar9 < password->_M_string_length);
  }
  puVar6 = (undefined8 *)operator_new(0x14);
  *puVar6 = 0;
  puVar6[1] = 0;
  *(undefined4 *)(puVar6 + 2) = 0;
  puVar2 = (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
           .super__Vector_impl_data._M_start;
  *(undefined4 *)(puVar6 + 2) = *(undefined4 *)(puVar2 + 0x10);
  uVar4 = *(undefined8 *)(puVar2 + 8);
  *puVar6 = *(undefined8 *)puVar2;
  puVar6[1] = uVar4;
  iVar3 = (int)(protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
               _M_impl.super__Vector_impl_data._M_finish - (int)puVar2;
  iVar13 = iVar3 + -0x28;
  __n = (size_type)iVar13;
  iVar8 = (iVar13 / 0x14 + 1) -
          (uint)((iVar3 * -0x33333333 + 0x19999990U >> 2 | iVar3 * 0x40000000) < 0xccccccd);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_b8,__n,
             (allocator_type *)local_130);
  memcpy((void *)local_b8,
         (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start + 0x14,__n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,__n,(allocator_type *)local_130);
  context._88_8_ = __n;
  passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = iVar13;
  SHA1_Init((SHA_CTX *)local_130);
  uVar1 = *(undefined4 *)(puVar6 + 2);
  xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*puVar6;
  uVar4 = puVar6[1];
  if (0 < iVar8) {
    passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = iVar8 + -1;
    lVar12 = 0;
    md = &xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage;
    lVar10 = 0;
    iVar13 = 0;
    do {
      SHA1_Update((SHA_CTX *)local_130,(void *)local_68,
                  (long)passwdBytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)local_68);
      SHA1_Update((SHA_CTX *)local_130,md,0x14);
      SHA1_Final((uchar *)md,(SHA_CTX *)local_130);
      SHA1_Init((SHA_CTX *)local_130);
      puVar2 = encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage + lVar10;
      if (iVar13 < (int)passwdBytes.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
        *(undefined4 *)(puVar2 + 0x10) = uVar1;
        *(pointer *)puVar2 =
             xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        *(undefined8 *)(puVar2 + 8) = uVar4;
      }
      else {
        memcpy(puVar2,md,
               (size_t)(xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start +
                       (lVar12 - (long)encrKey.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)));
      }
      iVar13 = iVar13 + 1;
      lVar10 = lVar10 + 0x14;
      lVar12 = lVar12 + -0x14;
    } while (iVar8 != iVar13);
  }
  uVar4 = context._88_8_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,context._88_8_,&local_31);
  if (0 < passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_) {
    lVar10 = 0;
    do {
      (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
      _M_impl.super__Vector_impl_data._M_start[lVar10] =
           encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage[lVar10] ^ *(byte *)((long)local_b8 + lVar10);
      lVar10 = lVar10 + 1;
    } while (uVar4 != lVar10);
  }
  SHA1_Update((SHA_CTX *)local_130,(void *)local_68,
              (long)passwdBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start - (long)local_68);
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  SHA1_Update((SHA_CTX *)local_130,puVar2,
              (long)(__return_storage_ptr__->
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2);
  SHA1_Final((uchar *)&xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(SHA_CTX *)local_130);
  lVar10 = 0;
  do {
    if (digest[lVar10 + -8] !=
        (protectedKey->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar10 + (iVar3 + -0x14)]) {
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar6 = &PTR__exception_0014bac8;
      puVar6[1] = "Key password incorrect";
      __cxa_throw(puVar6,&key_exception::typeinfo,std::exception::~exception);
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x14);
  if (encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)xorKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (local_b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_b8,
                    (long)encrKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_b8);
  }
  operator_delete(puVar6,0x14);
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    (long)passwdBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> recoverKey(const std::string& password,
                                const std::vector<uint8_t>& protectedKey)
{
    std::vector<uint8_t> passwdBytes(password.length() * 2);
    for (unsigned i = 0, j = 0; i < password.length(); i++) {
        passwdBytes[j++] = 0;
        passwdBytes[j++] = (uint8_t)password[i];
    }

    // Get the salt associated with this key (the first SALT_LEN bytes
    // protectedKey
    std::vector<uint8_t> salt(SALT_LEN);
    arraycopy8(protectedKey, 0, salt, 0, SALT_LEN);

    // Determine the number of digest rounds
    int encrKeyLen = protectedKey.size() - SALT_LEN - DIGEST_LEN;
    int numRounds = encrKeyLen / DIGEST_LEN;
    if ((encrKeyLen % DIGEST_LEN) != 0)
        numRounds++;

    // Get the encrypted key portion and store it in "encrKey"
    std::vector<uint8_t> encrKey(encrKeyLen);
    arraycopy8(protectedKey, SALT_LEN, encrKey, 0, encrKeyLen);

    // Set up the uint8_t array which will be XORed with "encrKey"
    std::vector<uint8_t> xorKey(encrKeyLen);

    SHA_CTX context;
    SHA1_Init(&context);

    uint8_t digest[DIGEST_LEN];
    arraycopy8(salt, 0, digest, 0, DIGEST_LEN);

    // Compute the digests, and store them in "xorKey"
    for (int i = 0, xorOffset = 0; i < numRounds;
         i++, xorOffset += DIGEST_LEN) {
        SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
        SHA1_Update(&context, &digest[0], DIGEST_LEN);
        SHA1_Final(&digest[0], &context);
        SHA1_Init(&context);
        // Copy the digest into "xorKey"
        if (i < numRounds - 1) {
            arraycopy8(digest, 0, xorKey, xorOffset, DIGEST_LEN);
        } else {
            arraycopy8(digest, 0, xorKey, xorOffset, xorKey.size() - xorOffset);
        }
    }

    // XOR "encrKey" with "xorKey", and store the result in "plainKey"
    std::vector<uint8_t> plainKey(encrKeyLen);
    for (int i = 0; i < encrKeyLen; i++) {
        plainKey[i] = (uint8_t)(encrKey[i] ^ xorKey[i]);
    }

    // Check the integrity of the recovered key by concatenating it with
    // the password, digesting the concatenation, and comparing the
    // result of the digest operation with the digest provided at the end
    // of 'protectedKey'. If the two digest values are
    // different, throw an exception.
    SHA1_Update(&context, &passwdBytes[0], passwdBytes.size());
    SHA1_Update(&context, &plainKey[0], plainKey.size());
    SHA1_Final(&digest[0], &context);

    for (int i = 0; i < DIGEST_LEN; i++) {
        if (digest[i] != protectedKey[SALT_LEN + encrKeyLen + i]) {
            throw key_exception("Key password incorrect");
        }
    }

    return plainKey;
}